

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int fxp_read_recv(sftp_packet *pktin,sftp_request *req,char *buffer,int len)

{
  ptrlen pVar1;
  void *local_50;
  ulong local_48;
  ptrlen data;
  int len_local;
  char *buffer_local;
  sftp_request *req_local;
  sftp_packet *pktin_local;
  
  safefree(req);
  if (pktin->type == 0x67) {
    pVar1 = BinarySource_get_string(pktin->binarysource_);
    local_50 = pVar1.ptr;
    local_48 = pVar1.len;
    if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
      if ((ulong)(long)len < local_48) {
        fxp_internal_error("READ returned more bytes than requested");
        sftp_pkt_free(pktin);
        pktin_local._4_4_ = -1;
      }
      else {
        memcpy(buffer,local_50,local_48);
        sftp_pkt_free(pktin);
        pktin_local._4_4_ = (int)pVar1.len;
      }
    }
    else {
      fxp_internal_error("READ returned malformed SSH_FXP_DATA packet");
      sftp_pkt_free(pktin);
      pktin_local._4_4_ = -1;
    }
  }
  else {
    fxp_got_status(pktin);
    sftp_pkt_free(pktin);
    pktin_local._4_4_ = -1;
  }
  return pktin_local._4_4_;
}

Assistant:

int fxp_read_recv(struct sftp_packet *pktin, struct sftp_request *req,
                  char *buffer, int len)
{
    sfree(req);
    if (pktin->type == SSH_FXP_DATA) {
        ptrlen data;

        data = get_string(pktin);
        if (get_err(pktin)) {
            fxp_internal_error("READ returned malformed SSH_FXP_DATA packet");
            sftp_pkt_free(pktin);
            return -1;
        }

        if (data.len > len) {
            fxp_internal_error("READ returned more bytes than requested");
            sftp_pkt_free(pktin);
            return -1;
        }

        memcpy(buffer, data.ptr, data.len);
        sftp_pkt_free(pktin);
        return data.len;
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return -1;
    }
}